

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

int emit_dqt(j_compress_ptr cinfo,int index)

{
  long lVar1;
  uint val;
  int in_ESI;
  long *in_RDI;
  uint qval;
  int i;
  int prec;
  JQUANT_TBL *qtbl;
  JPEG_MARKER in_stack_ffffffffffffffdc;
  int iVar2;
  int iVar3;
  
  lVar1 = in_RDI[(long)in_ESI + 0xc];
  if (lVar1 == 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x34;
    *(int *)(*in_RDI + 0x2c) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  iVar3 = 0;
  for (iVar2 = 0; iVar2 < 0x40; iVar2 = iVar2 + 1) {
    if (0xff < *(ushort *)(lVar1 + (long)iVar2 * 2)) {
      iVar3 = 1;
    }
  }
  if (*(int *)(lVar1 + 0x80) == 0) {
    emit_marker((j_compress_ptr)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffdc);
    emit_2bytes((j_compress_ptr)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffdc);
    emit_byte((j_compress_ptr)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffdc);
    for (iVar2 = 0; iVar2 < 0x40; iVar2 = iVar2 + 1) {
      val = (uint)*(ushort *)(lVar1 + (long)jpeg_natural_order[iVar2] * 2);
      if (iVar3 != 0) {
        emit_byte((j_compress_ptr)CONCAT44(iVar3,iVar2),val);
      }
      emit_byte((j_compress_ptr)CONCAT44(iVar3,iVar2),val);
    }
    *(undefined4 *)(lVar1 + 0x80) = 1;
  }
  return iVar3;
}

Assistant:

LOCAL(int)
emit_dqt(j_compress_ptr cinfo, int index)
/* Emit a DQT marker */
/* Returns the precision used (0 = 8bits, 1 = 16bits) for baseline checking */
{
  JQUANT_TBL *qtbl = cinfo->quant_tbl_ptrs[index];
  int prec;
  int i;

  if (qtbl == NULL)
    ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, index);

  prec = 0;
  for (i = 0; i < DCTSIZE2; i++) {
    if (qtbl->quantval[i] > 255)
      prec = 1;
  }

  if (!qtbl->sent_table) {
    emit_marker(cinfo, M_DQT);

    emit_2bytes(cinfo, prec ? DCTSIZE2 * 2 + 1 + 2 : DCTSIZE2 + 1 + 2);

    emit_byte(cinfo, index + (prec << 4));

    for (i = 0; i < DCTSIZE2; i++) {
      /* The table entries must be emitted in zigzag order. */
      unsigned int qval = qtbl->quantval[jpeg_natural_order[i]];
      if (prec)
        emit_byte(cinfo, (int)(qval >> 8));
      emit_byte(cinfo, (int)(qval & 0xFF));
    }

    qtbl->sent_table = TRUE;
  }

  return prec;
}